

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

_Bool checkhttpprefix(Curl_easy *data,char *s)

{
  curl_slist *pcVar1;
  char *__s;
  int iVar2;
  size_t max;
  curl_slist **ppcVar3;
  
  ppcVar3 = &(data->set).http200aliases;
  do {
    pcVar1 = *ppcVar3;
    if (pcVar1 == (curl_slist *)0x0) {
      iVar2 = Curl_raw_nequal("HTTP/",s,5);
      return iVar2 != 0;
    }
    __s = pcVar1->data;
    max = strlen(__s);
    iVar2 = Curl_raw_nequal(__s,s,max);
    ppcVar3 = &pcVar1->next;
  } while (iVar2 == 0);
  return true;
}

Assistant:

static bool
checkhttpprefix(struct Curl_easy *data,
                const char *s)
{
  struct curl_slist *head = data->set.http200aliases;
  bool rc = FALSE;
#ifdef CURL_DOES_CONVERSIONS
  /* convert from the network encoding using a scratch area */
  char *scratch = strdup(s);
  if(NULL == scratch) {
    failf (data, "Failed to allocate memory for conversion!");
    return FALSE; /* can't return CURLE_OUT_OF_MEMORY so return FALSE */
  }
  if(CURLE_OK != Curl_convert_from_network(data, scratch, strlen(s)+1)) {
    /* Curl_convert_from_network calls failf if unsuccessful */
    free(scratch);
    return FALSE; /* can't return CURLE_foobar so return FALSE */
  }
  s = scratch;
#endif /* CURL_DOES_CONVERSIONS */

  while(head) {
    if(checkprefix(head->data, s)) {
      rc = TRUE;
      break;
    }
    head = head->next;
  }

  if(!rc && (checkprefix("HTTP/", s)))
    rc = TRUE;

#ifdef CURL_DOES_CONVERSIONS
  free(scratch);
#endif /* CURL_DOES_CONVERSIONS */
  return rc;
}